

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O2

void duckdb::ExecuteMakeTimestamp<long>(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference input_00;
  
  if (*(long *)(input + 8) - *(long *)input == 0x68) {
    input_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,0);
    UnaryExecutor::Execute<long,duckdb::timestamp_t,duckdb::timestamp_t(*)(long)>
              (input_00,result,*(idx_t *)(input + 0x18),
               MakeTimestampOperator::Operation<long,duckdb::timestamp_t>,CAN_THROW_RUNTIME_ERROR);
    return;
  }
  SenaryExecutor::
  Execute<long,long,long,long,long,double,duckdb::timestamp_t,duckdb::timestamp_t(*)(long,long,long,long,long,double)>
            (input,result,
             MakeTimestampOperator::Operation<long,long,long,long,long,double,duckdb::timestamp_t>);
  return;
}

Assistant:

static void ExecuteMakeTimestamp(DataChunk &input, ExpressionState &state, Vector &result) {
	if (input.ColumnCount() == 1) {
		auto func = MakeTimestampOperator::Operation<T, timestamp_t>;
		UnaryExecutor::Execute<T, timestamp_t>(input.data[0], result, input.size(), func);
		return;
	}

	D_ASSERT(input.ColumnCount() == 6);

	auto func = MakeTimestampOperator::Operation<T, T, T, T, T, double, timestamp_t>;
	SenaryExecutor::Execute<T, T, T, T, T, double, timestamp_t>(input, result, func);
}